

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fileio.c
# Opt level: O0

void prvTidyfilesink_putByte(void *sinkData,byte bv)

{
  FILE *fout;
  byte bv_local;
  void *sinkData_local;
  
  fputc((uint)bv,(FILE *)sinkData);
  return;
}

Assistant:

void TIDY_CALL TY_(filesink_putByte)( void* sinkData, byte bv )
{
  FILE* fout = (FILE*) sinkData;
  fputc( bv, fout );
#if defined(ENABLE_DEBUG_LOG)
  if (fileno(fout) != 2)
  {
      if (bv != 0x0d)
      {
          /*\
           * avoid duplicate newline - SPRTF will translate an 0x0d to CRLF,
           *  and do the same with the following 0x0a
          \*/
          SPRTF("%c",bv);
      }
  }
#endif
}